

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_object_create(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  JSContext *in_RDI;
  JSValue *in_R8;
  JSValue JVar2;
  JSValue obj;
  JSValue props;
  JSValue proto;
  JSValueUnion JVar3;
  JSValue in_stack_ffffffffffffff88;
  JSContext *pJVar4;
  JSContext *ctx_00;
  JSValueUnion local_10;
  JSContext *local_8;
  
  JVar2 = *in_R8;
  iVar1 = JS_IsObject(*in_R8);
  if ((iVar1 == 0) && (iVar1 = JS_IsNull(JVar2), iVar1 == 0)) {
    _local_10 = JS_ThrowTypeError(in_RDI,"not a prototype");
  }
  else {
    JVar2 = JS_NewObjectProto((JSContext *)0x1a81f0,in_stack_ffffffffffffff88);
    JVar3 = JVar2.u;
    pJVar4 = (JSContext *)JVar2.tag;
    ctx_00 = pJVar4;
    iVar1 = JS_IsException(JVar2);
    if (iVar1 == 0) {
      iVar1 = JS_IsUndefined(in_R8[1]);
      if ((iVar1 == 0) &&
         (iVar1 = JS_ObjectDefineProperties
                            ((JSContext *)obj.u.ptr,stack0x00000028,(JSValue)stack0x00000018),
         iVar1 != 0)) {
        JVar2.tag = (int64_t)pJVar4;
        JVar2.u.ptr = JVar3.ptr;
        JS_FreeValue(ctx_00,JVar2);
        local_10.ptr = (void *)(local_10 << 0x20);
        local_8 = (JSContext *)0x6;
      }
      else {
        local_8 = pJVar4;
        local_10.ptr = JVar3.ptr;
      }
    }
    else {
      local_10.ptr = (void *)(local_10 << 0x20);
      local_8 = (JSContext *)0x6;
    }
  }
  return _local_10;
}

Assistant:

static JSValue js_object_create(JSContext *ctx, JSValueConst this_val,
                                int argc, JSValueConst *argv)
{
    JSValueConst proto, props;
    JSValue obj;

    proto = argv[0];
    if (!JS_IsObject(proto) && !JS_IsNull(proto))
        return JS_ThrowTypeError(ctx, "not a prototype");
    obj = JS_NewObjectProto(ctx, proto);
    if (JS_IsException(obj))
        return JS_EXCEPTION;
    props = argv[1];
    if (!JS_IsUndefined(props)) {
        if (JS_ObjectDefineProperties(ctx, obj, props)) {
            JS_FreeValue(ctx, obj);
            return JS_EXCEPTION;
        }
    }
    return obj;
}